

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O3

int Cudd_zddReduceHeap(DdManager *table,Cudd_ReorderingType heuristic,int minsize)

{
  DdHook *pDVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  abctime aVar7;
  
  iVar3 = 1;
  if ((uint)minsize <= table->keysZ - table->deadZ) {
    if (heuristic == CUDD_REORDER_SAME) {
      heuristic = table->autoMethodZ;
    }
    if (heuristic != CUDD_REORDER_NONE) {
      table->reorderings = table->reorderings + 1;
      empty = table->zero;
      pvVar6 = (void *)Extra_CpuTime();
      for (pDVar1 = table->preReorderingHook; pDVar1 != (DdHook *)0x0; pDVar1 = pDVar1->next) {
        iVar3 = (*pDVar1->f)(table,"ZDD",(void *)heuristic);
        if (iVar3 == 0) {
          return 0;
        }
      }
      cuddCacheFlush(table);
      cuddGarbageCollect(table,0);
      zddTotalNumberSwapping = 0;
      iVar4 = cuddZddTreeSifting(table,heuristic);
      iVar3 = 0;
      if ((iVar4 != 0) &&
         ((zddReorderPostprocess(table), table->realignZ == 0 ||
          (iVar5 = cuddBddAlignToZdd(table), iVar3 = 0, iVar5 != 0)))) {
        uVar2 = table->keysZ * 2;
        if ((table->reorderings < 0x14) || (table->nextDyn < uVar2)) {
          table->nextDyn = uVar2;
        }
        else {
          table->nextDyn = table->nextDyn + 0x14;
        }
        table->reordered = 1;
        for (pDVar1 = table->postReorderingHook; pDVar1 != (DdHook *)0x0; pDVar1 = pDVar1->next) {
          iVar3 = (*pDVar1->f)(table,"ZDD",pvVar6);
          if (iVar3 == 0) {
            return 0;
          }
        }
        aVar7 = Extra_CpuTime();
        table->reordTime = table->reordTime + (aVar7 - (long)pvVar6);
        iVar3 = iVar4;
      }
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_zddReduceHeap(
  DdManager * table /* DD manager */,
  Cudd_ReorderingType heuristic /* method used for reordering */,
  int minsize /* bound below which no reordering occurs */)
{
    DdHook       *hook;
    int          result;
    unsigned int nextDyn;
#ifdef DD_STATS
    unsigned int initialSize;
    unsigned int finalSize;
#endif
    long         localTime;

    /* Don't reorder if there are too many dead nodes. */
    if (table->keysZ - table->deadZ < (unsigned) minsize)
        return(1);

    if (heuristic == CUDD_REORDER_SAME) {
        heuristic = table->autoMethodZ;
    }
    if (heuristic == CUDD_REORDER_NONE) {
        return(1);
    }

    /* This call to Cudd_zddReduceHeap does initiate reordering. Therefore
    ** we count it.
    */
    table->reorderings++;
    empty = table->zero;

    localTime = util_cpu_time();

    /* Run the hook functions. */
    hook = table->preReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "ZDD", (void *)heuristic);
        if (res == 0) return(0);
        hook = hook->next;
    }

    /* Clear the cache and collect garbage. */
    zddReorderPreprocess(table);
    zddTotalNumberSwapping = 0;

#ifdef DD_STATS
    initialSize = table->keysZ;

    switch(heuristic) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        (void) fprintf(table->out,"#:I_RANDOM  ");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
        (void) fprintf(table->out,"#:I_SIFTING ");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        (void) fprintf(table->out,"#:I_LINSIFT ");
        break;
    default:
        (void) fprintf(table->err,"Unsupported ZDD reordering method\n");
        return(0);
    }
    (void) fprintf(table->out,"%8d: initial size",initialSize); 
#endif

    result = cuddZddTreeSifting(table,heuristic);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    finalSize = table->keysZ;
    (void) fprintf(table->out,"#:F_REORDER %8d: final size\n",finalSize); 
    (void) fprintf(table->out,"#:T_REORDER %8g: total time (sec)\n",
                   ((double)(util_cpu_time() - localTime)/1000.0)); 
    (void) fprintf(table->out,"#:N_REORDER %8d: total swaps\n",
                   zddTotalNumberSwapping);
#endif

    if (result == 0)
        return(0);

    if (!zddReorderPostprocess(table))
        return(0);

    if (table->realignZ) {
        if (!cuddBddAlignToZdd(table))
            return(0);
    }

    nextDyn = table->keysZ * DD_DYN_RATIO;
    if (table->reorderings < 20 || nextDyn > table->nextDyn)
        table->nextDyn = nextDyn;
    else
        table->nextDyn += 20;

    table->reordered = 1;

    /* Run hook functions. */
    hook = table->postReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "ZDD", (void *)localTime);
        if (res == 0) return(0);
        hook = hook->next;
    }
    /* Update cumulative reordering time. */
    table->reordTime += util_cpu_time() - localTime;

    return(result);

}